

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_tests.cpp
# Opt level: O1

void __thiscall pool_tests::random_allocations::test_method(random_allocations *this)

{
  byte bVar1;
  void *pvVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  undefined8 uVar8;
  ulong uVar9;
  char *unaff_RBX;
  size_t __n;
  char *pcVar10;
  char *__src;
  void *alignment;
  iterator in_R8;
  iterator pvVar11;
  iterator in_R9;
  iterator pvVar12;
  size_t bytes;
  char *pcVar13;
  long lVar14;
  ulong uVar15;
  char *unaff_R14;
  PtrSizeAlignment *x;
  FastRandomContext *this_00;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  void *ptr;
  PoolResource<128UL,_8UL> resource;
  check_type cVar16;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  lazy_ostream local_160;
  undefined1 *local_150;
  char **local_148;
  assertion_result local_140;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  void *local_108;
  binary_expr<boost::test_tools::assertion::value_expr<void_*&>,_std::nullptr_t,_boost::test_tools::assertion::op::NE<void_*,_std::nullptr_t,_void>_>
  local_100;
  PoolResource<128UL,_8UL> local_f0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  PoolResource<128UL,_8UL>::PoolResource(&local_f0,0x10000);
  this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng;
  lVar7 = 0;
  __src = (char *)0x0;
  pcVar10 = (char *)0x0;
  pcVar13 = (char *)0x0;
  do {
    if (__src == pcVar10) {
LAB_00521bce:
      do {
        pcVar4 = (char *)RandomMixin<FastRandomContext>::randbits
                                   (&this_00->super_RandomMixin<FastRandomContext>,3);
        pcVar6 = unaff_RBX;
        if ((char *)0x7 >= pcVar4) {
          pcVar6 = pcVar4;
        }
        unaff_RBX = (char *)((ulong)pcVar6 & 0xffffffff);
      } while ((char *)0x7 < pcVar4);
      bVar1 = (byte)pcVar6;
      do {
        pcVar4 = (char *)RandomMixin<FastRandomContext>::randbits
                                   (&this_00->super_RandomMixin<FastRandomContext>,8);
        pcVar6 = unaff_R14;
        if ((char *)0xc7 >= pcVar4) {
          pcVar6 = pcVar4;
        }
        unaff_R14 = (char *)((ulong)pcVar6 & 0xffffffff);
      } while ((char *)0xc7 < pcVar4);
      alignment = (void *)(1L << (bVar1 & 0x3f));
      bytes = ((ulong)(long)(int)pcVar6 >> (bVar1 & 0x3f)) + 1 << (bVar1 & 0x3f);
      local_108 = PoolResource<128UL,_8UL>::Allocate(&local_f0,bytes,(size_t)alignment);
      local_118 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
      ;
      local_110 = "";
      local_128 = &boost::unit_test::basic_cstring<char_const>::null;
      local_120 = &boost::unit_test::basic_cstring<char_const>::null;
      file.m_end = (iterator)0x89;
      file.m_begin = (iterator)&local_118;
      msg.m_end = in_R9;
      msg.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_128,msg)
      ;
      local_100.m_lhs.m_value = &local_108;
      local_100.m_rhs = (void *)0x0;
      boost::test_tools::assertion::
      binary_expr<boost::test_tools::assertion::value_expr<void_*&>,_std::nullptr_t,_boost::test_tools::assertion::op::NE<void_*,_std::nullptr_t,_void>_>
      ::evaluate(&local_140,&local_100,false);
      local_170 = "ptr != nullptr";
      local_168 = "";
      local_160.m_empty = false;
      local_160._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
      local_150 = boost::unit_test::lazy_ostream::inst;
      local_148 = &local_170;
      local_180 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
      ;
      local_178 = "";
      pvVar11 = (iterator)0x1;
      pvVar12 = (iterator)0xe;
      boost::test_tools::tt_detail::report_assertion
                (&local_140,&local_160,1,0xe,WARN,_cVar16,(size_t)&local_180,0x89);
      boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
      local_190 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
      ;
      local_188 = "";
      local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_198 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0x8a;
      file_00.m_begin = (iterator)&local_190;
      msg_00.m_end = pvVar12;
      msg_00.m_begin = pvVar11;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1a0,
                 msg_00);
      local_100.m_lhs.m_value = (void **)((long)alignment - 1U & (ulong)local_108);
      local_100.m_rhs = (void *)((ulong)local_100.m_rhs & 0xffffffff00000000);
      boost::test_tools::assertion::
      binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_int,_boost::test_tools::assertion::op::EQ<unsigned_long,_int,_void>_>
      ::evaluate(&local_140,
                 (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_int,_boost::test_tools::assertion::op::EQ<unsigned_long,_int,_void>_>
                  *)&local_100,false);
      local_170 = "(reinterpret_cast<uintptr_t>(ptr) & (alignment - 1)) == 0";
      local_168 = "";
      local_160.m_empty = false;
      local_160._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
      local_150 = boost::unit_test::lazy_ostream::inst;
      local_148 = &local_170;
      local_1b0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
      ;
      local_1a8 = "";
      in_R8 = (iterator)0x1;
      in_R9 = (iterator)0xe;
      boost::test_tools::tt_detail::report_assertion
                (&local_140,&local_160,1,0xe,WARN,_cVar16,(size_t)&local_1b0,0x8a);
      boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
      pvVar2 = local_108;
      if (pcVar10 == pcVar13) {
        __n = (long)pcVar10 - (long)__src;
        if (__n == 0x7ffffffffffffff8) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            uVar8 = std::__throw_length_error("vector::_M_realloc_insert");
            if (alignment != (void *)0x0) {
              operator_delete(alignment,(long)pcVar13 - (long)alignment);
            }
            PoolResource<128UL,_8UL>::~PoolResource(&local_f0);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              _Unwind_Resume(uVar8);
            }
          }
          goto LAB_0052214a;
        }
        lVar14 = (long)__n >> 3;
        uVar15 = lVar14 * -0x5555555555555555;
        uVar5 = uVar15;
        if (__src == pcVar10) {
          uVar5 = 1;
        }
        uVar9 = uVar5 + uVar15;
        if (0x555555555555554 < uVar9) {
          uVar9 = 0x555555555555555;
        }
        if (CARRY8(uVar5,uVar15)) {
          uVar9 = 0x555555555555555;
        }
        if (uVar9 == 0) {
          pcVar6 = (char *)0x0;
        }
        else {
          pcVar6 = (char *)operator_new(uVar9 * 0x18);
        }
        *(void **)(pcVar6 + lVar14 * 8) = pvVar2;
        *(size_t *)(pcVar6 + (lVar14 + 1) * 8) = bytes;
        *(void **)(pcVar6 + (lVar14 + 2) * 8) = alignment;
        if (0 < (long)__n) {
          memmove(pcVar6,__src,__n);
        }
        if (__src != (char *)0x0) {
          operator_delete(__src,(long)pcVar13 - (long)__src);
        }
        pcVar10 = pcVar6 + __n;
        pcVar13 = pcVar6 + uVar9 * 0x18;
        unaff_RBX = pcVar10;
        unaff_R14 = pcVar6;
      }
      else {
        *(void **)pcVar10 = local_108;
        *(size_t *)(pcVar10 + 8) = bytes;
        *(void **)(pcVar10 + 0x10) = alignment;
        unaff_RBX = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
        ;
        pcVar6 = __src;
        unaff_R14 = "";
      }
      pcVar10 = pcVar10 + 0x18;
      __src = pcVar6;
    }
    else {
      do {
        pcVar4 = (char *)RandomMixin<FastRandomContext>::randbits
                                   (&this_00->super_RandomMixin<FastRandomContext>,2);
        pcVar6 = unaff_RBX;
        if ((char *)0x3 >= pcVar4) {
          pcVar6 = pcVar4;
        }
        unaff_RBX = (char *)((ulong)pcVar6 & 0xffffffff);
      } while ((char *)0x3 < pcVar4);
      if ((int)pcVar6 != 0) goto LAB_00521bce;
      unaff_R14 = (char *)(((long)pcVar10 - (long)__src >> 3) * -0x5555555555555555 + -1);
      if (unaff_R14 == (char *)0x0) {
        uVar3 = 0x40;
      }
      else {
        lVar14 = 0x3f;
        if (unaff_R14 != (char *)0x0) {
          for (; (ulong)unaff_R14 >> lVar14 == 0; lVar14 = lVar14 + -1) {
          }
        }
        uVar3 = (uint)lVar14 ^ 0x3f;
      }
      do {
        pcVar6 = (char *)RandomMixin<FastRandomContext>::randbits
                                   (&this_00->super_RandomMixin<FastRandomContext>,0x40 - uVar3);
      } while (unaff_R14 < pcVar6);
      unaff_RBX = (char *)((long)pcVar6 * 3);
      PoolResource<128UL,_8UL>::Deallocate
                (&local_f0,*(void **)(__src + (long)pcVar6 * 0x18),
                 *(size_t *)(__src + ((long)pcVar6 * 3 + 1) * 8),
                 *(size_t *)(__src + ((long)pcVar6 * 3 + 2) * 8));
      *(undefined8 *)(__src + ((long)pcVar6 * 3 + 2) * 8) = *(undefined8 *)(pcVar10 + -8);
      pcVar4 = pcVar10 + -0x18;
      uVar8 = *(undefined8 *)(pcVar10 + -0x10);
      pcVar10 = pcVar10 + -0x18;
      *(undefined8 *)(__src + (long)pcVar6 * 0x18) = *(undefined8 *)pcVar4;
      *(undefined8 *)(__src + (long)pcVar6 * 0x18 + 8) = uVar8;
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 1000);
  if (__src != pcVar10) {
    pcVar6 = __src;
    do {
      PoolResource<128UL,_8UL>::Deallocate
                (&local_f0,*(void **)pcVar6,*(size_t *)(pcVar6 + 8),*(size_t *)(pcVar6 + 0x10));
      pcVar6 = pcVar6 + 0x18;
    } while (pcVar6 != pcVar10);
  }
  PoolResourceTester::CheckAllDataAccountedFor<128ul,8ul>(&local_f0);
  if (__src != (char *)0x0) {
    operator_delete(__src,(long)pcVar13 - (long)__src);
  }
  PoolResource<128UL,_8UL>::~PoolResource(&local_f0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0052214a:
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(random_allocations)
{
    struct PtrSizeAlignment {
        void* ptr;
        size_t bytes;
        size_t alignment;
    };

    // makes a bunch of random allocations and gives all of them back in random order.
    auto resource = PoolResource<128, 8>(65536);
    std::vector<PtrSizeAlignment> ptr_size_alignment{};
    for (size_t i = 0; i < 1000; ++i) {
        // make it a bit more likely to allocate than deallocate
        if (ptr_size_alignment.empty() || 0 != m_rng.randrange(4)) {
            // allocate a random item
            std::size_t alignment = std::size_t{1} << m_rng.randrange(8);          // 1, 2, ..., 128
            std::size_t size = (m_rng.randrange(200) / alignment + 1) * alignment; // multiple of alignment
            void* ptr = resource.Allocate(size, alignment);
            BOOST_TEST(ptr != nullptr);
            BOOST_TEST((reinterpret_cast<uintptr_t>(ptr) & (alignment - 1)) == 0);
            ptr_size_alignment.push_back({ptr, size, alignment});
        } else {
            // deallocate a random item
            auto& x = ptr_size_alignment[m_rng.randrange(ptr_size_alignment.size())];
            resource.Deallocate(x.ptr, x.bytes, x.alignment);
            x = ptr_size_alignment.back();
            ptr_size_alignment.pop_back();
        }
    }

    // deallocate all the rest
    for (auto const& x : ptr_size_alignment) {
        resource.Deallocate(x.ptr, x.bytes, x.alignment);
    }

    PoolResourceTester::CheckAllDataAccountedFor(resource);
}